

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushOverrideID(ImGuiID id)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID id_local;
  
  g._4_4_ = id;
  ImVector<unsigned_int>::push_back(&GImGui->CurrentWindow->IDStack,(uint *)((long)&g + 4));
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->IDStack.push_back(id);
}